

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_NodeIntersectLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void **ppvVar4;
  int iVar5;
  int b;
  Aig_Obj_t **pEnd2;
  Aig_Obj_t **pEnd1;
  Aig_Obj_t **pBeg2;
  Aig_Obj_t **pBeg1;
  Aig_Obj_t **pBeg;
  Vec_Ptr_t *vArr_local;
  Vec_Ptr_t *vArr2_local;
  Vec_Ptr_t *vArr1_local;
  
  pBeg2 = (Aig_Obj_t **)vArr1->pArray;
  pEnd1 = (Aig_Obj_t **)vArr2->pArray;
  ppvVar3 = vArr1->pArray;
  iVar1 = vArr1->nSize;
  ppvVar4 = vArr2->pArray;
  iVar2 = vArr2->nSize;
  iVar5 = Vec_PtrSize(vArr1);
  b = Vec_PtrSize(vArr2);
  iVar5 = Abc_MaxInt(iVar5,b);
  Vec_PtrGrow(vArr,iVar5);
  pBeg1 = (Aig_Obj_t **)vArr->pArray;
  while (pBeg2 < ppvVar3 + iVar1 && pEnd1 < ppvVar4 + iVar2) {
    if ((*pBeg2)->Id == (*pEnd1)->Id) {
      *pBeg1 = *pBeg2;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
      pBeg1 = pBeg1 + 1;
    }
    else if ((*pBeg2)->Id < (*pEnd1)->Id) {
      pBeg2 = pBeg2 + 1;
    }
    else {
      pEnd1 = pEnd1 + 1;
    }
  }
  vArr->nSize = (int)((long)pBeg1 - (long)vArr->pArray >> 3);
  if (vArr->nCap < vArr->nSize) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                  ,0x504,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vArr1->nSize < vArr->nSize) {
    __assert_fail("vArr->nSize <= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                  ,0x505,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vArr->nSize <= vArr2->nSize) {
    return;
  }
  __assert_fail("vArr->nSize <= vArr2->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                ,0x506,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_NodeIntersectLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Abc_MaxInt( Vec_PtrSize(vArr1), Vec_PtrSize(vArr2) ) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
//            *pBeg++ = *pBeg1++;
            pBeg1++;
        else 
//            *pBeg++ = *pBeg2++;
            pBeg2++;
    }
//    while ( pBeg1 < pEnd1 )
//        *pBeg++ = *pBeg1++;
//    while ( pBeg2 < pEnd2 )
//        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize <= vArr1->nSize );
    assert( vArr->nSize <= vArr2->nSize );
}